

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int libssh2_userauth_keyboard_interactive_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  int iVar1;
  time_t start_time;
  uchar *puVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uchar *local_70;
  uchar **local_68;
  size_t *local_60;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *local_58;
  ulong local_50;
  char *local_48;
  packet_requirev_state_t *local_40;
  LIBSSH2_USERAUTH_KBDINT_PROMPT **local_38;
  
  local_58 = response_callback;
  local_48 = user;
  start_time = time((time_t *)0x0);
  local_38 = &session->userauth_kybd_prompts;
  local_68 = &session->userauth_kybd_data;
  local_60 = &session->userauth_kybd_data_len;
  local_40 = &session->userauth_kybd_packet_requirev_state;
  local_50 = (ulong)user_len;
  do {
    if (session->userauth_kybd_state == libssh2_NB_state_idle) {
      session->userauth_kybd_auth_name = (uchar *)0x0;
      session->userauth_kybd_auth_instruction = (uchar *)0x0;
      session->userauth_kybd_num_prompts = 0;
      session->userauth_kybd_auth_failure = 1;
      ((packet_requirev_state_t *)(local_38 + 2))->start = 0;
      *local_38 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
      local_38[1] = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
      session->userauth_kybd_packet_len = (ulong)(user_len + 0x37);
      puVar2 = (uchar *)(*session->alloc)((ulong)(user_len + 0x37),&session->abstract);
      session->userauth_kybd_data = puVar2;
      if (puVar2 != (uchar *)0x0) {
        local_70 = puVar2 + 1;
        *puVar2 = '2';
        _libssh2_store_str(&local_70,local_48,local_50);
        _libssh2_store_str(&local_70,"ssh-connection",0xe);
        _libssh2_store_str(&local_70,"keyboard-interactive",0x14);
        _libssh2_store_u32(&local_70,0);
        _libssh2_store_u32(&local_70,0);
        session->userauth_kybd_state = libssh2_NB_state_created;
        goto LAB_0011e186;
      }
      iVar1 = -6;
      pcVar3 = "Unable to allocate memory for keyboard-interactive authentication";
      local_70 = (uchar *)0x0;
LAB_0011e481:
      iVar1 = _libssh2_error(session,iVar1,pcVar3);
    }
    else {
LAB_0011e186:
      if (session->userauth_kybd_state != libssh2_NB_state_created) goto LAB_0011e22e;
      iVar1 = _libssh2_transport_send
                        (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                         (uchar *)0x0,0);
      if (iVar1 != 0) {
        if (iVar1 == -0x25) {
LAB_0011e472:
          iVar1 = -0x25;
          pcVar3 = "Would block";
        }
        else {
          (*session->free)(session->userauth_kybd_data,&session->abstract);
          session->userauth_kybd_data = (uchar *)0x0;
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar1 = -7;
          pcVar3 = "Unable to send keyboard-interactive request";
        }
        goto LAB_0011e481;
      }
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      do {
        session->userauth_kybd_state = libssh2_NB_state_sent;
LAB_0011e22e:
        if (session->userauth_kybd_state == libssh2_NB_state_sent) {
          iVar1 = _libssh2_packet_requirev
                            (session,"43<",local_68,local_60,0,(uchar *)0x0,0,local_40);
          if (iVar1 == 0) {
            if (*local_60 != 0) {
              puVar2 = *local_68;
              if (*puVar2 != '3') {
                if (*puVar2 != '4') {
                  iVar1 = userauth_keyboard_interactive_decode_info_request(session);
                  if (-1 < iVar1) {
                    (*local_58)((char *)session->userauth_kybd_auth_name,
                                (int)session->userauth_kybd_auth_name_len,
                                (char *)session->userauth_kybd_auth_instruction,
                                (int)session->userauth_kybd_auth_instruction_len,
                                session->userauth_kybd_num_prompts,session->userauth_kybd_prompts,
                                session->userauth_kybd_responses,&session->abstract);
                    session->userauth_kybd_packet_len = 5;
                    if ((ulong)session->userauth_kybd_num_prompts != 0) {
                      sVar4 = 5;
                      lVar6 = 0;
                      do {
                        uVar5 = (ulong)*(uint *)((long)&session->userauth_kybd_responses->length +
                                                lVar6);
                        if (-sVar4 - 5 < uVar5) goto LAB_0011e62b;
                        sVar4 = sVar4 + uVar5 + 4;
                        session->userauth_kybd_packet_len = sVar4;
                        lVar6 = lVar6 + 0x10;
                      } while ((ulong)session->userauth_kybd_num_prompts << 4 != lVar6);
                    }
                    (*session->free)(session->userauth_kybd_data,&session->abstract);
                    local_70 = (uchar *)(*session->alloc)(session->userauth_kybd_packet_len,
                                                          &session->abstract);
                    session->userauth_kybd_data = local_70;
                    if (local_70 != (uchar *)0x0) {
                      *local_70 = '=';
                      local_70 = local_70 + 1;
                      _libssh2_store_u32(&local_70,session->userauth_kybd_num_prompts);
                      if (session->userauth_kybd_num_prompts != 0) {
                        lVar6 = 8;
                        uVar5 = 0;
                        do {
                          _libssh2_store_str(&local_70,
                                             *(char **)((long)session->userauth_kybd_responses +
                                                       lVar6 + -8),
                                             (ulong)*(uint *)((long)&session->
                                                  userauth_kybd_responses->text + lVar6));
                          uVar5 = uVar5 + 1;
                          lVar6 = lVar6 + 0x10;
                        } while (uVar5 < session->userauth_kybd_num_prompts);
                      }
                      session->userauth_kybd_state = libssh2_NB_state_sent1;
                      goto LAB_0011e440;
                    }
LAB_0011e62b:
                    iVar1 = -6;
                    pcVar3 = "Unable to allocate memory for keyboard-interactive response packet";
                    goto LAB_0011e4da;
                  }
                  goto LAB_0011e4df;
                }
                (*session->free)(puVar2,&session->abstract);
                session->userauth_kybd_data = (uchar *)0x0;
                *(byte *)&session->state = (byte)session->state | 8;
                session->userauth_kybd_state = libssh2_NB_state_idle;
                iVar1 = 0;
                goto LAB_0011e486;
              }
              (*session->free)(puVar2,&session->abstract);
              session->userauth_kybd_data = (uchar *)0x0;
              session->userauth_kybd_state = libssh2_NB_state_idle;
              iVar1 = -0x12;
              pcVar3 = "Authentication failed (keyboard-interactive)";
              goto LAB_0011e481;
            }
          }
          else if (iVar1 == -0x25) goto LAB_0011e472;
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar1 = -0x12;
          pcVar3 = "Waiting for keyboard USERAUTH response";
          goto LAB_0011e481;
        }
LAB_0011e440:
        if (session->userauth_kybd_state == libssh2_NB_state_sent1) {
          iVar1 = _libssh2_transport_send
                            (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                             (uchar *)0x0,0);
          if (iVar1 == 0) {
            session->userauth_kybd_auth_failure = 0;
          }
          else {
            if (iVar1 == -0x25) goto LAB_0011e472;
            iVar1 = -7;
            pcVar3 = "Unable to send userauth-keyboard-interactive request";
LAB_0011e4da:
            _libssh2_error(session,iVar1,pcVar3);
          }
        }
LAB_0011e4df:
        (*session->free)(session->userauth_kybd_data,&session->abstract);
        session->userauth_kybd_data = (uchar *)0x0;
        if ((session->userauth_kybd_prompts != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) &&
           (session->userauth_kybd_num_prompts != 0)) {
          lVar6 = 0;
          uVar5 = 0;
          do {
            (*session->free)(*(void **)((long)&session->userauth_kybd_prompts->text + lVar6),
                             &session->abstract);
            *(undefined8 *)((long)&session->userauth_kybd_prompts->text + lVar6) = 0;
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 0x18;
          } while (uVar5 < session->userauth_kybd_num_prompts);
        }
        if ((session->userauth_kybd_responses != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) &&
           (session->userauth_kybd_num_prompts != 0)) {
          lVar6 = 0;
          uVar5 = 0;
          do {
            (*session->free)(*(void **)((long)&session->userauth_kybd_responses->text + lVar6),
                             &session->abstract);
            *(undefined8 *)((long)&session->userauth_kybd_responses->text + lVar6) = 0;
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 0x10;
          } while (uVar5 < session->userauth_kybd_num_prompts);
        }
        if (session->userauth_kybd_prompts != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          (*session->free)(session->userauth_kybd_prompts,&session->abstract);
          session->userauth_kybd_prompts = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
        }
        if (session->userauth_kybd_responses != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          (*session->free)(session->userauth_kybd_responses,&session->abstract);
          session->userauth_kybd_responses = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        if (session->userauth_kybd_auth_name != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_name,&session->abstract);
          session->userauth_kybd_auth_name = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_instruction != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_instruction,&session->abstract);
          session->userauth_kybd_auth_instruction = (uchar *)0x0;
        }
      } while (session->userauth_kybd_auth_failure == 0);
      session->userauth_kybd_state = libssh2_NB_state_idle;
      iVar1 = -1;
    }
LAB_0011e486:
    if (session == (LIBSSH2_SESSION *)0x0) {
      return iVar1;
    }
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_keyboard_interactive_ex(LIBSSH2_SESSION *session,
                                         const char *user,
                                         unsigned int user_len,
                                         LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                             ((*response_callback)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_keyboard_interactive(session, user, user_len,
                                               response_callback));
    return rc;
}